

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoElement.h.h
# Opt level: O3

void __thiscall
TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra>::TPZGeoElement
          (TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *this,void **vtt,
          TPZGeoMesh *DestMesh,
          TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  long lVar3;
  mapped_type_conflict *pmVar4;
  mapped_type_conflict mVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  
  TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>,vtt + 1,DestMesh,
             &cp->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>,gl2lcNdMap,gl2lcElMap);
  pvVar2 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).super_TPZGeoEl = pvVar2;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).fGeo.
                   super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
            *(long *)((long)pvVar2 + -0x60) + -0x48) = vtt[5];
  p_Var1 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar8 = 0;
  do {
    lVar3 = cp->fSubEl[lVar8];
    if (lVar3 == -1) {
      mVar5 = -1;
    }
    else {
      p_Var6 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var6 == (_Base_ptr)0x0) {
LAB_011848b5:
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZGeoElement.h.h"
                   ,0xcf);
      }
      do {
        if (lVar3 <= (long)*(size_t *)(p_Var6 + 1)) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(long)*(size_t *)(p_Var6 + 1) < lVar3];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
         (lVar3 < (long)((_Rb_tree_header *)p_Var7)->_M_node_count)) goto LAB_011848b5;
      pmVar4 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](gl2lcElMap,cp->fSubEl + lVar8);
      mVar5 = *pmVar4;
    }
    this->fSubEl[lVar8] = mVar5;
    lVar8 = lVar8 + 1;
    if (lVar8 == 6) {
      return;
    }
  } while( true );
}

Assistant:

TPZGeoElement<TGeo,TRef>::TPZGeoElement(TPZGeoMesh &DestMesh,
										const TPZGeoElement &cp,
										std::map<int64_t,int64_t> &gl2lcNdMap,
										std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElement::ClassId),
TPZGeoElRefLess<TGeo>(DestMesh, cp, gl2lcNdMap, gl2lcElMap)
{
	int i, n = TRef::NSubEl;
	for(i = 0; i < n; i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i]=-1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
#ifdef PZ_LOG
            TPZLogger logger("pz.mesh.tpzgeoelement");

            if (logger.isDebugEnabled()) {
              std::stringstream sout;
              sout << "ERROR in - " << __PRETTY_FUNCTION__
                   << " subelement index is not in map from original to "
                      "clone indexes! Son index = "
                   << fSubEl[i];
              LOGPZ_ERROR(logger, sout.str().c_str());
            }
#endif
            DebugStop();
        }
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}